

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_qmfb.c
# Opt level: O3

int jpc_ft_analyze(jpc_fix_t *a,int xstart,int ystart,int width,int height,int stride)

{
  jpc_fix_t *pjVar1;
  int iVar2;
  jpc_fix_t *pjVar3;
  jpc_fix_t *pjVar4;
  jpc_fix_t *pjVar5;
  long *plVar6;
  jpc_fix_t *pjVar7;
  long lVar8;
  long *plVar9;
  uint uVar10;
  int iVar11;
  jpc_fix_t *pjVar12;
  ulong uVar13;
  long *plVar14;
  jpc_fix_t *pjVar15;
  int iVar16;
  uint uVar17;
  uint uVar18;
  long lVar19;
  uint uVar20;
  jpc_fix_t *pjVar21;
  uint uVar22;
  bool bVar23;
  int iVar25;
  int iVar26;
  undefined1 auVar24 [16];
  undefined1 auVar27 [16];
  uint local_88;
  uint local_78;
  uint local_70;
  
  uVar18 = ystart & 1;
  local_70 = width & 0xfffffff0;
  pjVar12 = a;
  if ((width & 0xfffffff0U) != 0) {
    uVar10 = (height - uVar18) + 1 >> 1;
    uVar13 = (ulong)(uVar10 * stride);
    local_78 = height & 1;
    bVar23 = (height & 1U) == uVar18;
    iVar16 = ((height - uVar18) - uVar10) - (uint)bVar23;
    iVar11 = (uVar10 - (uVar18 == 0)) - (uint)!bVar23;
    pjVar7 = a + uVar13;
    pjVar15 = a + (uint)stride;
    pjVar21 = a + (uint)stride + uVar13;
    uVar10 = 0;
    do {
      jpc_qmfb_split_colgrp(pjVar12,height,stride,uVar18);
      if ((uint)height < 2) {
        if (uVar18 != 0) {
          lVar8 = 0;
          do {
            iVar2 = (int)pjVar12[lVar8] * 2;
            iVar25 = (int)(pjVar12 + lVar8)[1] * 2;
            pjVar5 = pjVar12 + lVar8;
            *pjVar5 = CONCAT44(-(uint)(iVar2 < 0),iVar2);
            *(int *)(pjVar5 + 2) = iVar25;
            *(uint *)((long)pjVar5 + 0x14) = -(uint)(iVar25 < 0);
            lVar8 = lVar8 + 2;
          } while (lVar8 != 0x10);
        }
      }
      else {
        pjVar5 = pjVar12 + uVar13;
        iVar2 = iVar16;
        pjVar1 = pjVar5;
        pjVar3 = pjVar15;
        pjVar4 = pjVar12;
        if (uVar18 != 0) {
          lVar8 = 0;
          do {
            pjVar7[lVar8] = pjVar7[lVar8] - pjVar12[lVar8];
            lVar8 = lVar8 + 1;
          } while ((int)lVar8 != 0x10);
          pjVar1 = pjVar5 + (uint)stride;
        }
        for (; iVar2 != 0; iVar2 = iVar2 + -1) {
          lVar8 = 0;
          do {
            pjVar1[lVar8] = pjVar1[lVar8] - (long)(int)((ulong)(pjVar3[lVar8] + pjVar4[lVar8]) >> 1)
            ;
            lVar8 = lVar8 + 1;
          } while ((int)lVar8 != 0x10);
          pjVar1 = pjVar1 + (uint)stride;
          pjVar3 = pjVar3 + (uint)stride;
          pjVar4 = pjVar4 + (uint)stride;
        }
        if (local_78 == uVar18) {
          lVar8 = 0;
          do {
            pjVar1[lVar8] = pjVar1[lVar8] - pjVar4[lVar8];
            lVar8 = lVar8 + 1;
          } while ((int)lVar8 != 0x10);
        }
        iVar2 = iVar11;
        pjVar1 = pjVar12;
        pjVar3 = pjVar7;
        pjVar4 = pjVar21;
        if (uVar18 == 0) {
          lVar8 = 0;
          do {
            iVar25 = (int)((ulong)(pjVar12[uVar13 + lVar8] * 0x80000000 + 0x80000000) >> 0x20);
            iVar26 = (int)((ulong)((pjVar12 + uVar13 + lVar8)[1] * 0x80000000 + 0x80000000) >> 0x20)
            ;
            auVar24._4_4_ = iVar26;
            auVar24._0_4_ = iVar25;
            auVar24._8_4_ = iVar26;
            auVar24._12_4_ = iVar26 >> 0x1f;
            auVar27._0_8_ = pjVar12[lVar8] + (long)iVar25;
            auVar27._8_8_ = (pjVar12 + lVar8)[1] + auVar24._8_8_;
            *(undefined1 (*) [16])(pjVar12 + lVar8) = auVar27;
            lVar8 = lVar8 + 2;
          } while (lVar8 != 0x10);
          pjVar1 = pjVar12 + (uint)stride;
        }
        for (; iVar2 != 0; iVar2 = iVar2 + -1) {
          lVar8 = 0;
          do {
            pjVar1[lVar8] =
                 pjVar1[lVar8] + ((pjVar4[lVar8] + pjVar3[lVar8]) * 0x40000000 + 0x80000000 >> 0x20)
            ;
            lVar8 = lVar8 + 1;
          } while ((int)lVar8 != 0x10);
          pjVar5 = pjVar3 + (uint)stride;
          pjVar1 = pjVar1 + (uint)stride;
          pjVar3 = pjVar5;
          pjVar4 = pjVar4 + (uint)stride;
        }
        if (local_78 != uVar18) {
          lVar8 = 0;
          do {
            pjVar1[lVar8] = pjVar1[lVar8] + (pjVar5[lVar8] * 0x80000000 + 0x80000000 >> 0x20);
            lVar8 = lVar8 + 1;
          } while ((int)lVar8 != 0x10);
        }
      }
      pjVar12 = pjVar12 + 0x10;
      uVar10 = uVar10 + 0x10;
      pjVar7 = pjVar7 + 0x10;
      pjVar15 = pjVar15 + 0x10;
      pjVar21 = pjVar21 + 0x10;
    } while (uVar10 < local_70);
  }
  if (local_70 != width) {
    uVar10 = width & 0xf;
    jpc_qmfb_split_colres(pjVar12,height,uVar10,stride,uVar18);
    if ((uint)height < 2) {
      if (uVar10 != 0 && uVar18 != 0) {
        lVar8 = 0;
        do {
          pjVar12[lVar8] = (long)((int)pjVar12[lVar8] * 2);
          lVar8 = lVar8 + 1;
        } while (uVar10 != (uint)lVar8);
      }
    }
    else {
      uVar17 = (uVar18 ^ 1) + height >> 1;
      pjVar7 = pjVar12 + uVar17 * stride;
      pjVar15 = pjVar7;
      if (uVar18 != 0) {
        if (uVar10 != 0) {
          lVar8 = 0;
          do {
            pjVar7[lVar8] = pjVar7[lVar8] - pjVar12[lVar8];
            lVar8 = lVar8 + 1;
          } while (uVar10 != (uint)lVar8);
        }
        pjVar15 = pjVar7 + (uint)stride;
      }
      uVar20 = height & 1;
      pjVar21 = pjVar12;
      pjVar5 = pjVar12;
      for (iVar11 = (height - (uVar18 + uVar17)) - (uint)(uVar20 == uVar18); iVar11 != 0;
          iVar11 = iVar11 + -1) {
        pjVar5 = pjVar5 + (uint)stride;
        if (uVar10 != 0) {
          lVar8 = 0;
          do {
            pjVar15[lVar8] =
                 pjVar15[lVar8] - (long)(int)((ulong)(pjVar5[lVar8] + pjVar21[lVar8]) >> 1);
            lVar8 = lVar8 + 1;
          } while (uVar10 != (uint)lVar8);
        }
        pjVar15 = pjVar15 + (uint)stride;
        pjVar21 = pjVar21 + (uint)stride;
      }
      if (uVar10 != 0 && uVar20 == uVar18) {
        lVar8 = 0;
        do {
          pjVar15[lVar8] = pjVar15[lVar8] - pjVar21[lVar8];
          lVar8 = lVar8 + 1;
        } while (uVar10 != (uint)lVar8);
      }
      pjVar15 = pjVar12;
      if (uVar18 == 0) {
        if (uVar10 != 0) {
          lVar8 = 0;
          do {
            pjVar12[lVar8] = pjVar12[lVar8] + (pjVar7[lVar8] * 0x80000000 + 0x80000000 >> 0x20);
            lVar8 = lVar8 + 1;
          } while (uVar10 != (uint)lVar8);
        }
        pjVar15 = pjVar12 + (uint)stride;
      }
      iVar11 = (uVar17 - (uVar18 == 0)) - (uint)(uVar20 != uVar18);
      if (iVar11 != 0) {
        pjVar12 = pjVar12 + (ulong)(uint)stride + (ulong)(uVar17 * stride);
        do {
          if (uVar10 != 0) {
            lVar8 = 0;
            do {
              pjVar15[lVar8] =
                   pjVar15[lVar8] +
                   ((pjVar12[lVar8] + pjVar7[lVar8]) * 0x40000000 + 0x80000000 >> 0x20);
              lVar8 = lVar8 + 1;
            } while (uVar10 != (uint)lVar8);
          }
          pjVar15 = pjVar15 + (uint)stride;
          pjVar7 = pjVar7 + (uint)stride;
          pjVar12 = pjVar12 + (uint)stride;
          iVar11 = iVar11 + -1;
        } while (iVar11 != 0);
      }
      if (uVar10 != 0 && uVar20 != uVar18) {
        lVar8 = 0;
        do {
          pjVar15[lVar8] = pjVar15[lVar8] + (pjVar7[lVar8] * 0x80000000 + 0x80000000 >> 0x20);
          lVar8 = lVar8 + 1;
        } while (uVar10 != (uint)lVar8);
      }
    }
  }
  if (height != 0) {
    uVar20 = xstart & 1;
    uVar17 = (uVar20 ^ 1) + width >> 1;
    local_88 = width & 1;
    bVar23 = (width & 1U) == uVar20;
    uVar10 = (uint)bVar23;
    uVar18 = (uint)((xstart & 1U) == 0);
    uVar22 = (uint)!bVar23;
    pjVar12 = a + uVar17;
    iVar11 = 0;
    do {
      jpc_qmfb_split_row(a,width,uVar20);
      if ((uint)width < 2) {
        if ((xstart & 1U) != 0) {
          *a = (long)((int)*a * 2);
        }
      }
      else {
        plVar6 = a + uVar17;
        plVar9 = plVar6;
        if ((xstart & 1U) != 0) {
          *plVar6 = *plVar6 - *a;
          plVar9 = plVar6 + 1;
        }
        plVar14 = a;
        if ((width - uVar20) - uVar17 != uVar10) {
          lVar19 = 0;
          lVar8 = 0;
          do {
            plVar9[lVar8] = plVar9[lVar8] - (long)(int)((ulong)(a[lVar8 + 1] + a[lVar8]) >> 1);
            lVar8 = lVar8 + 1;
            lVar19 = lVar19 + -8;
          } while (((width - uVar10) - uVar17) - uVar20 != (int)lVar8);
          plVar9 = (long *)((long)plVar9 - lVar19);
          plVar14 = (long *)((long)a - lVar19);
        }
        if (local_88 == uVar20) {
          *plVar9 = *plVar9 - *plVar14;
        }
        plVar9 = a;
        if ((xstart & 1U) == 0) {
          *a = *a + (*plVar6 * 0x80000000 + 0x80000000 >> 0x20);
          plVar9 = a + 1;
        }
        if (uVar17 - uVar18 != uVar22) {
          lVar19 = 0;
          lVar8 = 0;
          do {
            plVar9[lVar8] =
                 plVar9[lVar8] +
                 ((pjVar12[lVar8 + 1] + pjVar12[lVar8]) * 0x40000000 + 0x80000000 >> 0x20);
            lVar8 = lVar8 + 1;
            lVar19 = lVar19 + -8;
          } while ((uVar22 - uVar17) + uVar18 + (int)lVar8 != 0);
          plVar9 = (long *)((long)plVar9 - lVar19);
          plVar6 = (long *)((long)pjVar12 - lVar19);
        }
        if (local_88 != uVar20) {
          *plVar9 = *plVar9 + (*plVar6 * 0x80000000 + 0x80000000 >> 0x20);
        }
      }
      a = a + stride;
      iVar11 = iVar11 + 1;
      pjVar12 = pjVar12 + stride;
    } while (iVar11 != height);
  }
  return 0;
}

Assistant:

int jpc_ft_analyze(jpc_fix_t *a, int xstart, int ystart, int width, int height,
  int stride)
{
	const unsigned numrows = height;
	const unsigned numcols = width;
	const unsigned rowparity = ystart & 1;
	const unsigned colparity = xstart & 1;
	jpc_fix_t *startptr;

	const unsigned maxcols = (numcols / JPC_QMFB_COLGRPSIZE) * JPC_QMFB_COLGRPSIZE;
	startptr = &a[0];
	for (unsigned i = 0; i < maxcols; i += JPC_QMFB_COLGRPSIZE) {
		jpc_qmfb_split_colgrp(startptr, numrows, stride, rowparity);
		jpc_ft_fwdlift_colgrp(startptr, numrows, stride, rowparity);
		startptr += JPC_QMFB_COLGRPSIZE;
	}
	if (maxcols < numcols) {
		jpc_qmfb_split_colres(startptr, numrows, numcols - maxcols, stride,
		  rowparity);
		jpc_ft_fwdlift_colres(startptr, numrows, numcols - maxcols, stride,
		  rowparity);
	}

	startptr = &a[0];
	for (unsigned i = 0; i < numrows; ++i) {
		jpc_qmfb_split_row(startptr, numcols, colparity);
		jpc_ft_fwdlift_row(startptr, numcols, colparity);
		startptr += stride;
	}

	return 0;

}